

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O0

void __thiscall
sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode::~CacheNode(CacheNode *this)

{
  map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>
  *in_RDI;
  LRUCache<std::pair<sjtu::orderType,_long>_> *unaff_retaddr;
  iterator *in_stack_00000008;
  map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>
  *in_stack_00000010;
  pair<sjtu::orderType,_long> *in_stack_fffffffffffffff0;
  
  if (((ulong)in_RDI[6].nodebegin & 1) != 0) {
    f_write(unaff_retaddr,(locType *)in_RDI,in_stack_fffffffffffffff0);
  }
  map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::find
            (in_RDI,(long *)in_stack_fffffffffffffff0);
  map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::erase
            (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

~CacheNode()
			{
				if (is_dirty_page) bel -> f_write(offset , value);
				bel -> table.erase(bel -> table.find(offset));
			}